

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# rotating_file_sink-inl.h
# Opt level: O2

void __thiscall
spdlog::sinks::rotating_file_sink<std::mutex>::rotate_now(rotating_file_sink<std::mutex> *this)

{
  mutex *__mutex;
  
  __mutex = &(this->super_base_sink<std::mutex>).mutex_;
  std::mutex::lock((mutex *)__mutex);
  rotate_(this);
  pthread_mutex_unlock((pthread_mutex_t *)__mutex);
  return;
}

Assistant:

SPDLOG_INLINE void rotating_file_sink<Mutex>::rotate_now() {
    std::lock_guard<Mutex> lock(base_sink<Mutex>::mutex_);
    rotate_();
}